

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

TestCaseGroup *
vkt::SpirVAssembly::anon_unknown_5::createOpSRemComputeGroup64
          (TestContext *testCtx,qpTestResult negFailResult)

{
  allocator<long> *paVar1;
  long lVar2;
  long lVar3;
  deUint32 seed;
  TestCaseGroup *pTVar4;
  TestNode *pTVar5;
  char *pcVar6;
  reference pvVar7;
  Buffer<long> *pBVar8;
  SpvAsmComputeShaderCase *this;
  pointer local_32c;
  int local_324;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_320;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_310;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_300;
  allocator<char> local_2e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  allocator<char> local_2c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  allocator<char> local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  int local_1d8;
  allocator<long> local_1d1;
  int ndx;
  undefined1 local_1c8 [8];
  vector<long,_std::allocator<long>_> outputInts;
  value_type_conflict6 local_1a8;
  undefined1 local_1a0 [8];
  vector<long,_std::allocator<long>_> inputInts2;
  value_type_conflict6 local_180;
  undefined1 local_178 [8];
  vector<long,_std::allocator<long>_> inputInts1;
  ComputeShaderSpec spec;
  CaseParams *params;
  int caseNdx;
  CaseParams cases [2];
  undefined1 local_48 [4];
  int numElements;
  Random rnd;
  undefined1 local_28 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  qpTestResult negFailResult_local;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._12_4_
       = negFailResult;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar4,testCtx,"opsrem64","Test the 64-bit OpSRem instruction");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&rnd.m_rnd.z + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28,pTVar4
            );
  pTVar5 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_28)->super_TestNode;
  pcVar6 = tcu::TestNode::getName(pTVar5);
  seed = deStringHash(pcVar6);
  de::Random::Random((Random *)local_48,seed);
  cases[0].name = "Output doesn\'t match with expected";
  cases[0].failMessage._0_4_ = 1;
  cases[0].failMessage._4_1_ = 1;
  cases[0]._16_8_ = (long)"Binary doesn\'t look like SPIR-V at all" + 0x23;
  cases[1].name = "Inconsistent results, but within specification";
  cases[1].failMessage._0_4_ =
       group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
       _12_4_;
  cases[1].failMessage._4_1_ = 0;
  for (params._4_4_ = 0; params._4_4_ < 2; params._4_4_ = params._4_4_ + 1) {
    spec.verifyIO =
         (_func_bool_vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>_ptr_vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>_ptr_vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>_ptr_TestLog_ptr
          *)&cases[(long)params._4_4_ + -1].failResult;
    ComputeShaderSpec::ComputeShaderSpec
              ((ComputeShaderSpec *)
               &inputInts1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_180 = 0;
    paVar1 = (allocator<long> *)
             ((long)&inputInts2.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<long>::allocator(paVar1);
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)local_178,200,&local_180,paVar1);
    std::allocator<long>::~allocator
              ((allocator<long> *)
               ((long)&inputInts2.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    local_1a8 = 0;
    paVar1 = (allocator<long> *)
             ((long)&outputInts.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<long>::allocator(paVar1);
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)local_1a0,200,&local_1a8,paVar1);
    std::allocator<long>::~allocator
              ((allocator<long> *)
               ((long)&outputInts.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    _ndx = 0;
    std::allocator<long>::allocator(&local_1d1);
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)local_1c8,200,(value_type_conflict6 *)&ndx,
               &local_1d1);
    std::allocator<long>::~allocator(&local_1d1);
    if (((byte)spec.verifyIO[0x14] & 1) == 0) {
      fillRandomInt64sLogDistributed
                ((Random *)local_48,(vector<long,_std::allocator<long>_> *)local_178,200);
      SpirVAssembly::(anonymous_namespace)::fillRandomInt64sLogDistributed<bool(*)(long)>
                ((Random *)local_48,(vector<long,_std::allocator<long>_> *)local_1a0,200,
                 filterNotZero);
    }
    else {
      SpirVAssembly::(anonymous_namespace)::fillRandomInt64sLogDistributed<bool(*)(long)>
                ((Random *)local_48,(vector<long,_std::allocator<long>_> *)local_178,200,
                 filterNonNegative);
      SpirVAssembly::(anonymous_namespace)::fillRandomInt64sLogDistributed<bool(*)(long)>
                ((Random *)local_48,(vector<long,_std::allocator<long>_> *)local_1a0,200,
                 filterPositive);
    }
    for (local_1d8 = 0; local_1d8 < 200; local_1d8 = local_1d8 + 1) {
      pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)local_178,(long)local_1d8);
      lVar2 = *pvVar7;
      pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)local_1a0,(long)local_1d8);
      lVar3 = *pvVar7;
      pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)local_1c8,(long)local_1d8);
      *pvVar7 = lVar2 % lVar3;
    }
    pcVar6 = getComputeAsmShaderPreamble();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,pcVar6,&local_299);
    std::operator+(&local_278,"OpCapability Int64\n",&local_298);
    std::operator+(&local_258,&local_278,
                   "OpName %main           \"main\"\nOpName %id             \"gl_GlobalInvocationID\"\nOpDecorate %id BuiltIn GlobalInvocationId\nOpDecorate %buf BufferBlock\nOpDecorate %indata1 DescriptorSet 0\nOpDecorate %indata1 Binding 0\nOpDecorate %indata2 DescriptorSet 0\nOpDecorate %indata2 Binding 1\nOpDecorate %outdata DescriptorSet 0\nOpDecorate %outdata Binding 2\nOpDecorate %i64arr ArrayStride 8\nOpMemberDecorate %buf 0 Offset 0\n"
                  );
    pcVar6 = getComputeAsmCommonTypes();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,pcVar6,&local_2c1);
    std::operator+(&local_238,&local_258,&local_2c0);
    pcVar6 = getComputeAsmCommonInt64Types();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,pcVar6,&local_2e9);
    std::operator+(&local_218,&local_238,&local_2e8);
    std::operator+(&local_1f8,&local_218,
                   "%buf        = OpTypeStruct %i64arr\n%bufptr     = OpTypePointer Uniform %buf\n%indata1    = OpVariable %bufptr Uniform\n%indata2    = OpVariable %bufptr Uniform\n%outdata    = OpVariable %bufptr Uniform\n%id        = OpVariable %uvec3ptr Input\n%zero      = OpConstant %i64 0\n%main      = OpFunction %void None %voidf\n%label     = OpLabel\n%idval     = OpLoad %uvec3 %id\n%x         = OpCompositeExtract %u32 %idval 0\n%inloc1    = OpAccessChain %i64ptr %indata1 %zero %x\n%inval1    = OpLoad %i64 %inloc1\n%inloc2    = OpAccessChain %i64ptr %indata2 %zero %x\n%inval2    = OpLoad %i64 %inloc2\n%rem       = OpSRem %i64 %inval1 %inval2\n%outloc    = OpAccessChain %i64ptr %outdata %zero %x\n             OpStore %outloc %rem\n             OpReturn\n             OpFunctionEnd\n"
                  );
    std::__cxx11::string::operator=
              ((string *)
               &inputInts1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    pBVar8 = (Buffer<long> *)operator_new(0x20);
    Buffer<long>::Buffer(pBVar8,(vector<long,_std::allocator<long>_> *)local_178);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
              (&local_300,(BufferInterface *)pBVar8);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                 *)((long)&spec.entryPoint.field_2 + 8),&local_300);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_300);
    pBVar8 = (Buffer<long> *)operator_new(0x20);
    Buffer<long>::Buffer(pBVar8,(vector<long,_std::allocator<long>_> *)local_1a0);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
              (&local_310,(BufferInterface *)pBVar8);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                 *)((long)&spec.entryPoint.field_2 + 8),&local_310);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_310);
    pBVar8 = (Buffer<long> *)operator_new(0x20);
    Buffer<long>::Buffer(pBVar8,(vector<long,_std::allocator<long>_> *)local_1c8);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
              (&local_320,(BufferInterface *)pBVar8);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                 *)&spec.inputs.
                    super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_320);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_320);
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&local_32c,200,1,1);
    spec.numWorkGroups.m_data[0] = local_324;
    spec.outputs.
    super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_32c;
    spec.specConstants.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = *(undefined4 *)(spec.verifyIO + 0x10);
    std::__cxx11::string::operator=((string *)&spec.failResult,*(char **)(spec.verifyIO + 8));
    pTVar5 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_28)->super_TestNode;
    this = (SpvAsmComputeShaderCase *)operator_new(0x140);
    SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
              (this,testCtx,*(char **)spec.verifyIO,"",
               (ComputeShaderSpec *)
               &inputInts1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,COMPUTE_TEST_USES_INT64);
    tcu::TestNode::addChild(pTVar5,(TestNode *)this);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_1c8);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_1a0);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_178);
    ComputeShaderSpec::~ComputeShaderSpec
              ((ComputeShaderSpec *)
               &inputInts1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  pTVar4 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28)
  ;
  de::Random::~Random((Random *)local_48);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28);
  return pTVar4;
}

Assistant:

tcu::TestCaseGroup* createOpSRemComputeGroup64 (tcu::TestContext& testCtx, qpTestResult negFailResult)
{
	de::MovePtr<tcu::TestCaseGroup>	group			(new tcu::TestCaseGroup(testCtx, "opsrem64", "Test the 64-bit OpSRem instruction"));
	de::Random						rnd				(deStringHash(group->getName()));
	const int						numElements		= 200;

	const struct CaseParams
	{
		const char*		name;
		const char*		failMessage;		// customized status message
		qpTestResult	failResult;			// override status on failure
		bool			positive;
	} cases[] =
	{
		{ "positive",	"Output doesn't match with expected",				QP_TEST_RESULT_FAIL,	true },
		{ "all",		"Inconsistent results, but within specification",	negFailResult,			false },	// see below
	};
	// If either operand is negative the result is undefined. Some implementations may still return correct values.

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
	{
		const CaseParams&	params		= cases[caseNdx];
		ComputeShaderSpec	spec;
		vector<deInt64>		inputInts1	(numElements, 0);
		vector<deInt64>		inputInts2	(numElements, 0);
		vector<deInt64>		outputInts	(numElements, 0);

		if (params.positive)
		{
			fillRandomInt64sLogDistributed(rnd, inputInts1, numElements, filterNonNegative);
			fillRandomInt64sLogDistributed(rnd, inputInts2, numElements, filterPositive);
		}
		else
		{
			fillRandomInt64sLogDistributed(rnd, inputInts1, numElements);
			fillRandomInt64sLogDistributed(rnd, inputInts2, numElements, filterNotZero);
		}

		for (int ndx = 0; ndx < numElements; ++ndx)
		{
			// The return value of std::fmod() has the same sign as its first operand, which is how OpFRem spec'd.
			outputInts[ndx] = inputInts1[ndx] % inputInts2[ndx];
		}

		spec.assembly =
			"OpCapability Int64\n"

			+ string(getComputeAsmShaderPreamble()) +

			"OpName %main           \"main\"\n"
			"OpName %id             \"gl_GlobalInvocationID\"\n"

			"OpDecorate %id BuiltIn GlobalInvocationId\n"

			"OpDecorate %buf BufferBlock\n"
			"OpDecorate %indata1 DescriptorSet 0\n"
			"OpDecorate %indata1 Binding 0\n"
			"OpDecorate %indata2 DescriptorSet 0\n"
			"OpDecorate %indata2 Binding 1\n"
			"OpDecorate %outdata DescriptorSet 0\n"
			"OpDecorate %outdata Binding 2\n"
			"OpDecorate %i64arr ArrayStride 8\n"
			"OpMemberDecorate %buf 0 Offset 0\n"

			+ string(getComputeAsmCommonTypes())
			+ string(getComputeAsmCommonInt64Types()) +

			"%buf        = OpTypeStruct %i64arr\n"
			"%bufptr     = OpTypePointer Uniform %buf\n"
			"%indata1    = OpVariable %bufptr Uniform\n"
			"%indata2    = OpVariable %bufptr Uniform\n"
			"%outdata    = OpVariable %bufptr Uniform\n"

			"%id        = OpVariable %uvec3ptr Input\n"
			"%zero      = OpConstant %i64 0\n"

			"%main      = OpFunction %void None %voidf\n"
			"%label     = OpLabel\n"
			"%idval     = OpLoad %uvec3 %id\n"
			"%x         = OpCompositeExtract %u32 %idval 0\n"
			"%inloc1    = OpAccessChain %i64ptr %indata1 %zero %x\n"
			"%inval1    = OpLoad %i64 %inloc1\n"
			"%inloc2    = OpAccessChain %i64ptr %indata2 %zero %x\n"
			"%inval2    = OpLoad %i64 %inloc2\n"
			"%rem       = OpSRem %i64 %inval1 %inval2\n"
			"%outloc    = OpAccessChain %i64ptr %outdata %zero %x\n"
			"             OpStore %outloc %rem\n"
			"             OpReturn\n"
			"             OpFunctionEnd\n";

		spec.inputs.push_back	(BufferSp(new Int64Buffer(inputInts1)));
		spec.inputs.push_back	(BufferSp(new Int64Buffer(inputInts2)));
		spec.outputs.push_back	(BufferSp(new Int64Buffer(outputInts)));
		spec.numWorkGroups		= IVec3(numElements, 1, 1);
		spec.failResult			= params.failResult;
		spec.failMessage		= params.failMessage;

		group->addChild(new SpvAsmComputeShaderCase(testCtx, params.name, "", spec, COMPUTE_TEST_USES_INT64));
	}

	return group.release();
}